

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_35::decode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  uint8_t uVar1;
  uint uVar2;
  conversion_result cVar3;
  wostream *pwVar4;
  ulong uVar5;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar6;
  size_t i;
  wchar_t *local_3b8;
  size_t local_3b0;
  uint8_t buf [4];
  wstring_view s_local;
  wstring_view local_370;
  wstring res;
  wchar_t buf16 [2];
  anon_class_24_3_e5424b64 get_byte;
  wostringstream woss;
  wostringstream _woss;
  
  s_local._M_str = (wchar_t *)s._M_len;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = L'\0';
  i = 0;
  s_local._M_len = (size_t)global;
  while( true ) {
    while( true ) {
      if (s_local._M_len <= i) {
        __woss = res._M_string_length;
        string::string((string *)&woss,*(gc_heap **)this,(wstring_view *)&_woss);
        value::value(__return_storage_ptr__,(string *)&woss);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
        std::__cxx11::wstring::~wstring((wstring *)&res);
        return __return_storage_ptr__;
      }
      if (s_local._M_str[i] == L'%') break;
      std::__cxx11::wstring::push_back((wchar_t)&res);
      i = i + 1;
    }
    get_byte.s = &s_local;
    get_byte.i = &i;
    get_byte.global = (gc_heap_ptr<mjs::global_object> *)this;
    buf[0] = decode_uri::anon_class_24_3_e5424b64::operator()(&get_byte);
    buf[3] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    uVar2 = unicode::utf8_length_from_lead_code_unit(buf[0]);
    if (uVar2 == 0) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      pwVar4 = std::operator<<((wostream *)&woss,"Unsupported: ");
      bVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        (&s_local,i,0xffffffffffffffff);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,bVar6._M_str,bVar6._M_len);
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
      pwVar4 = std::operator<<((wostream *)&_woss,"Not implemented: ");
      std::__cxx11::wstringbuf::str();
      std::operator<<(pwVar4,(wstring *)&local_3b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_3b8);
      std::__cxx11::wstringbuf::str();
      local_370._M_len = local_3b0;
      local_370._M_str = local_3b8;
      throw_runtime_error(&local_370,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                          ,0xe9);
    }
    if (4 < uVar2) {
      __assert_fail("len <= sizeof(buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0xeb,
                    "value mjs::(anonymous namespace)::decode_uri(const gc_heap_ptr<global_object> &, const std::wstring_view)"
                   );
    }
    for (uVar5 = 1; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      if (s_local._M_str[i] != L'%') {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
        pwVar4 = std::operator<<((wostream *)&woss,"Unsupported: ");
        bVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                          (&s_local,i,0xffffffffffffffff);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,bVar6._M_str,bVar6._M_len);
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
        pwVar4 = std::operator<<((wostream *)&_woss,"Not implemented: ");
        std::__cxx11::wstringbuf::str();
        std::operator<<(pwVar4,(wstring *)&local_3b8);
        std::__cxx11::wstring::~wstring((wstring *)&local_3b8);
        std::__cxx11::wstringbuf::str();
        local_370._M_len = local_3b0;
        local_370._M_str = local_3b8;
        throw_runtime_error(&local_370,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                            ,0xf0);
      }
      uVar1 = decode_uri::anon_class_24_3_e5424b64::operator()(&get_byte);
      buf[uVar5] = uVar1;
    }
    cVar3 = unicode::utf8_to_utf32<unsigned_char>(buf,uVar2);
    if (uVar2 != cVar3.length) break;
    uVar2 = unicode::utf32_to_utf16<wchar_t>(cVar3.code_point,buf16);
    if (2 < uVar2) {
      __assert_fail("len16 <= sizeof(buf16)/sizeof(*buf16)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0xfc,
                    "value mjs::(anonymous namespace)::decode_uri(const gc_heap_ptr<global_object> &, const std::wstring_view)"
                   );
    }
    if (uVar2 == 0) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      pwVar4 = std::operator<<((wostream *)&woss,"Unsupported: ");
      bVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        (&s_local,i,0xffffffffffffffff);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,bVar6._M_str,bVar6._M_len);
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
      pwVar4 = std::operator<<((wostream *)&_woss,"Not implemented: ");
      std::__cxx11::wstringbuf::str();
      std::operator<<(pwVar4,(wstring *)&local_3b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_3b8);
      std::__cxx11::wstringbuf::str();
      local_370._M_len = local_3b0;
      local_370._M_str = local_3b8;
      throw_runtime_error(&local_370,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                          ,0x100);
    }
    std::__cxx11::wstring::insert<wchar_t*,void>
              ((wstring *)&res,(const_iterator)(res._M_dataplus._M_p + res._M_string_length),buf16,
               buf16 + uVar2);
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  pwVar4 = std::operator<<((wostream *)&woss,"Unsupported: ");
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,s_local._M_str,s_local._M_len);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
  pwVar4 = std::operator<<((wostream *)&_woss,"Not implemented: ");
  std::__cxx11::wstringbuf::str();
  std::operator<<(pwVar4,(wstring *)&local_3b8);
  std::__cxx11::wstring::~wstring((wstring *)&local_3b8);
  std::__cxx11::wstringbuf::str();
  local_370._M_len = local_3b0;
  local_370._M_str = local_3b8;
  throw_runtime_error(&local_370,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0xf8);
}

Assistant:

value decode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length();) {
        if (s[i] != '%') {
            res += s[i];
            ++i;
            continue;
        }
       auto get_byte = [&] () {
            assert(s[i] == '%');
            ++i;
            if (i + 2 > s.length()) {
                throw_uri_error(global);
            }
            i += 2;
            return static_cast<uint8_t>(get_hex_value2(&s[i-2]));
       };
       uint8_t buf[4] = { get_byte(), };
       const auto len = unicode::utf8_length_from_lead_code_unit(buf[0]);
       if (!len) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       assert(len <= sizeof(buf));
       for (unsigned j = 1; j < len; ++j) {
           if (s[i] != '%') {
               std::wostringstream woss;
               woss << "Unsupported: " << s.substr(i);
               NOT_IMPLEMENTED(woss.str());
           }
           buf[j] = get_byte();
       }
       auto conv = unicode::utf8_to_utf32(buf, len);
       if (conv.length != len) {
            std::wostringstream woss;
            woss << "Unsupported: " << s;
            NOT_IMPLEMENTED(woss.str());
        }
       wchar_t buf16[unicode::utf16_max_length];
       const auto len16 = unicode::utf32_to_utf16(conv.code_point, buf16);
       assert(len16 <= sizeof(buf16)/sizeof(*buf16));
       if (len16 == unicode::invalid_length) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       res.insert(res.end(), buf16, buf16 + len16);
    }
    return value{string{global.heap(), res}};
}